

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O2

bool __thiscall ON_ParseSettings::IsInteriorWhiteSpace(ON_ParseSettings *this,ON__UINT32 c)

{
  byte bVar1;
  uint uVar2;
  
  if (c - 0x2008 < 3) {
    bVar1 = *(byte *)((long)this->m_true_default_bits + 3) & 0x20;
LAB_00574e44:
    return bVar1 == 0;
  }
  if (c == 9) {
    if ((this->m_true_default_bits[0] & 0x4000000) != 0) {
      return false;
    }
    return true;
  }
  if (c == 0x20) {
    uVar2 = this->m_true_default_bits[0];
    if ((uVar2 >> 0x1b & 1) == 0) {
      return true;
    }
  }
  else {
    if (c == 0x202f) {
      bVar1 = *(byte *)((long)this->m_true_default_bits + 3) & 0x40;
      goto LAB_00574e44;
    }
    if (c != 0xa0) {
      return false;
    }
    uVar2 = this->m_true_default_bits[0];
  }
  return (uVar2 >> 0x1c & 1) == 0;
}

Assistant:

bool ON_ParseSettings::IsInteriorWhiteSpace(ON__UINT32 c) const
{
  switch(c)
  {
  case 0x0009: // horizontal tab
    if ( ParseHorizontalTabAsWhiteSpace() )
      return true;
    break;

  case 0x0020: // space
    if ( ParseSpaceAsWhiteSpace() )
      return true;

  case 0x00A0: // no-break space
    return ParseNoBreakSpaceAsWhiteSpace();
    break;

  case 0x2008: // thin space
  case 0x2009: // thin space
  case 0x200A: // hair thin space
    return ParseThinSpaceAsWhiteSpace();
    break;

  case 0x202F: // narrow no-break
    return ParseNoBreakThinSpaceAsWhiteSpace();
    break;
  }

  return false;
}